

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disflow.c
# Opt level: O1

void aom_compute_flow_at_point_c
               (uint8_t *src,uint8_t *ref,int x,int y,int width,int height,int stride,double *u,
               double *v)

{
  ulong uVar1;
  undefined1 auVar2 [12];
  undefined1 auVar3 [14];
  undefined1 auVar4 [14];
  undefined1 auVar5 [14];
  undefined1 auVar6 [12];
  undefined1 auVar7 [14];
  undefined1 auVar8 [12];
  unkbyte10 Var9;
  int i_1;
  int iVar10;
  long lVar11;
  undefined1 *puVar12;
  uint8_t *puVar13;
  short *psVar14;
  long lVar15;
  int sum;
  long lVar16;
  short *psVar17;
  uint uVar18;
  long lVar19;
  long lVar20;
  uint uVar21;
  int sum_3;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  uint uVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar32 [16];
  int iVar33;
  int iVar37;
  double dVar34;
  double dVar35;
  double dVar36;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar44;
  double dVar41;
  double dVar42;
  double dVar43;
  int iVar45;
  int iVar46;
  int iVar47;
  int iVar50;
  double dVar48;
  int iVar51;
  int iVar52;
  undefined1 auVar49 [16];
  ushort uVar59;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  double dVar60;
  undefined1 auVar61 [16];
  undefined1 auVar68 [16];
  int16_t dy [64];
  int16_t dx [64];
  int16_t tmp_ [80];
  undefined4 uStack_334;
  undefined4 uStack_330;
  undefined4 uStack_32c;
  short local_298 [64];
  short local_218 [64];
  short local_198 [48];
  undefined1 local_138 [264];
  undefined1 auVar55 [16];
  undefined1 auVar58 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  short sVar65;
  short sVar66;
  short sVar67;
  
  iVar10 = stride * y + x;
  uVar18 = ~stride;
  lVar19 = -1;
  do {
    lVar22 = 0;
    uVar21 = uVar18;
    do {
      lVar15 = 0;
      sVar65 = 0;
      uVar27 = uVar21;
      do {
        sVar65 = sVar65 + (ushort)src[(long)(int)uVar27 + (long)iVar10] *
                          *(short *)((long)&sobel_filter_sobel_a + lVar15);
        lVar15 = lVar15 + 2;
        uVar27 = uVar27 + 1;
      } while (lVar15 != 6);
      local_198[lVar19 * 8 + lVar22 + 8] = sVar65;
      lVar22 = lVar22 + 1;
      uVar21 = uVar21 + 1;
    } while (lVar22 != 8);
    lVar19 = lVar19 + 1;
    uVar18 = uVar18 + stride;
  } while (lVar19 != 9);
  psVar14 = local_198;
  lVar19 = 0;
  do {
    lVar22 = 0;
    psVar17 = psVar14;
    do {
      lVar15 = 0;
      sVar65 = 0;
      do {
        sVar65 = sVar65 + psVar17[lVar15 * 4] * *(short *)((long)&sobel_filter_sobel_b + lVar15);
        lVar15 = lVar15 + 2;
      } while (lVar15 != 6);
      local_218[lVar19 * 8 + lVar22] = sVar65;
      lVar22 = lVar22 + 1;
      psVar17 = psVar17 + 1;
    } while (lVar22 != 8);
    lVar19 = lVar19 + 1;
    psVar14 = psVar14 + 8;
  } while (lVar19 != 8);
  uVar18 = ~stride;
  lVar19 = -1;
  do {
    lVar22 = 0;
    uVar21 = uVar18;
    do {
      lVar15 = 0;
      sVar65 = 0;
      uVar27 = uVar21;
      do {
        sVar65 = sVar65 + (ushort)src[(long)(int)uVar27 + (long)iVar10] *
                          *(short *)((long)&sobel_filter_sobel_b + lVar15);
        lVar15 = lVar15 + 2;
        uVar27 = uVar27 + 1;
      } while (lVar15 != 6);
      local_198[lVar19 * 8 + lVar22 + 8] = sVar65;
      lVar22 = lVar22 + 1;
      uVar21 = uVar21 + 1;
    } while (lVar22 != 8);
    lVar19 = lVar19 + 1;
    uVar18 = uVar18 + stride;
  } while (lVar19 != 9);
  psVar14 = local_198;
  lVar19 = 0;
  do {
    lVar22 = 0;
    psVar17 = psVar14;
    do {
      lVar15 = 0;
      sVar65 = 0;
      do {
        sVar65 = sVar65 + psVar17[lVar15 * 4] * *(short *)((long)&sobel_filter_sobel_a + lVar15);
        lVar15 = lVar15 + 2;
      } while (lVar15 != 6);
      local_298[lVar19 * 8 + lVar22] = sVar65;
      lVar22 = lVar22 + 1;
      psVar17 = psVar17 + 1;
    } while (lVar22 != 8);
    lVar19 = lVar19 + 1;
    psVar14 = psVar14 + 8;
  } while (lVar19 != 8);
  lVar19 = 0;
  psVar14 = local_298;
  psVar17 = local_218;
  iVar47 = 0;
  iVar40 = 0;
  iVar33 = 0;
  do {
    iVar50 = 0;
    iVar51 = 0;
    iVar52 = 0;
    iVar44 = 0;
    iVar45 = 0;
    iVar46 = 0;
    iVar37 = 0;
    iVar38 = 0;
    iVar39 = 0;
    lVar22 = 0;
    do {
      uVar1 = *(ulong *)(psVar17 + lVar22);
      auVar53._8_8_ = 0;
      auVar53._0_8_ = uVar1;
      sVar67 = (short)(uVar1 >> 0x30);
      auVar64._8_4_ = 0;
      auVar64._0_8_ = uVar1;
      auVar64._12_2_ = sVar67;
      auVar64._14_2_ = sVar67;
      sVar66 = (short)(uVar1 >> 0x20);
      auVar63._12_4_ = auVar64._12_4_;
      auVar63._8_2_ = 0;
      auVar63._0_8_ = uVar1;
      auVar63._10_2_ = sVar66;
      auVar62._10_6_ = auVar63._10_6_;
      auVar62._8_2_ = sVar66;
      auVar62._0_8_ = uVar1;
      sVar65 = (short)(uVar1 >> 0x10);
      auVar61._8_8_ = auVar62._8_8_;
      auVar61._6_2_ = sVar65;
      auVar61._4_2_ = sVar65;
      auVar61._0_2_ = (short)uVar1;
      auVar61._2_2_ = auVar61._0_2_;
      auVar53 = pmulhw(auVar53,auVar53);
      uVar59 = sVar67 * sVar67;
      auVar54._0_10_ = (unkuint10)uVar59 << 0x30;
      auVar55._0_12_ = ZEXT212(uVar59) << 0x30;
      auVar55._12_2_ = uVar59;
      auVar55._14_2_ = auVar53._6_2_;
      auVar54._12_4_ = auVar55._12_4_;
      auVar54._10_2_ = auVar53._4_2_;
      Var9 = CONCAT64(auVar54._10_6_,CONCAT22(sVar66 * sVar66,uVar59));
      auVar6._4_8_ = (long)((unkuint10)Var9 >> 0x10);
      auVar6._2_2_ = auVar53._2_2_;
      auVar6._0_2_ = sVar65 * sVar65;
      iVar33 = iVar33 + CONCAT22(auVar53._0_2_,auVar61._0_2_ * auVar61._0_2_);
      iVar37 = iVar37 + auVar6._0_4_;
      iVar38 = iVar38 + (int)((unkuint10)Var9 >> 0x10);
      iVar39 = iVar39 + auVar54._12_4_;
      uVar1 = *(ulong *)(psVar14 + lVar22);
      auVar56._8_8_ = 0;
      auVar56._0_8_ = uVar1;
      sVar67 = (short)(uVar1 >> 0x30);
      auVar3._8_4_ = 0;
      auVar3._0_8_ = uVar1;
      auVar3._12_2_ = sVar67;
      sVar66 = (short)(uVar1 >> 0x20);
      auVar4._8_2_ = sVar66;
      auVar4._0_8_ = uVar1;
      auVar4._10_4_ = auVar3._10_4_;
      auVar7._6_8_ = 0;
      auVar7._0_6_ = auVar4._8_6_;
      sVar65 = (short)(uVar1 >> 0x10);
      auVar5._4_2_ = sVar65;
      auVar5._0_4_ = (uint)uVar1;
      auVar5._6_8_ = SUB148(auVar7 << 0x40,6);
      auVar68._0_4_ = (uint)uVar1 & 0xffff;
      auVar68._4_10_ = auVar5._4_10_;
      auVar68._14_2_ = 0;
      auVar53 = pmaddwd(auVar68,auVar61);
      iVar40 = iVar40 + auVar53._0_4_;
      iVar44 = iVar44 + auVar53._4_4_;
      iVar45 = iVar45 + auVar53._8_4_;
      iVar46 = iVar46 + auVar53._12_4_;
      auVar53 = pmulhw(auVar56,auVar56);
      uVar59 = sVar67 * sVar67;
      auVar57._0_10_ = (unkuint10)uVar59 << 0x30;
      auVar58._0_12_ = ZEXT212(uVar59) << 0x30;
      auVar58._12_2_ = uVar59;
      auVar58._14_2_ = auVar53._6_2_;
      auVar57._12_4_ = auVar58._12_4_;
      auVar57._10_2_ = auVar53._4_2_;
      Var9 = CONCAT64(auVar57._10_6_,CONCAT22(sVar66 * sVar66,uVar59));
      auVar8._4_8_ = (long)((unkuint10)Var9 >> 0x10);
      auVar8._2_2_ = auVar53._2_2_;
      auVar8._0_2_ = sVar65 * sVar65;
      iVar47 = iVar47 + CONCAT22(auVar53._0_2_,(short)uVar1 * (short)uVar1);
      iVar50 = iVar50 + auVar8._0_4_;
      iVar51 = iVar51 + (int)((unkuint10)Var9 >> 0x10);
      iVar52 = iVar52 + auVar57._12_4_;
      lVar22 = lVar22 + 4;
    } while (lVar22 != 8);
    iVar47 = iVar52 + iVar50 + iVar51 + iVar47;
    iVar40 = iVar46 + iVar44 + iVar45 + iVar40;
    iVar33 = iVar39 + iVar37 + iVar38 + iVar33;
    lVar19 = lVar19 + 1;
    psVar14 = psVar14 + 8;
    psVar17 = psVar17 + 8;
  } while (lVar19 != 8);
  dVar34 = (double)iVar40;
  dVar35 = 1.0 / ((double)(iVar33 + 1) * (double)(iVar47 + 1) - dVar34 * dVar34);
  lVar19 = (long)stride;
  lVar22 = lVar19 << 0x20;
  iVar40 = 0;
  do {
    dVar43 = *u;
    dVar41 = *v;
    dVar28 = floor(dVar43);
    dVar29 = floor(dVar41);
    dVar36 = dVar43 - dVar28;
    dVar41 = dVar41 - dVar29;
    dVar60 = dVar36 * dVar36;
    dVar42 = dVar36 * dVar60;
    dVar30 = rint((dVar42 * -0.5 + dVar36 * -0.5 + dVar60) * 16384.0);
    dVar31 = rint((dVar42 * 1.5 + dVar60 * -2.5 + 1.0) * 16384.0);
    dVar36 = rint((dVar42 * -1.5 + dVar36 * 0.5 + dVar60 + dVar60) * 16384.0);
    dVar42 = rint((dVar60 * -0.5 + dVar42 * 0.5) * 16384.0);
    dVar60 = dVar41 * dVar41;
    dVar48 = dVar41 * dVar60;
    iVar38 = (int)dVar28 + x;
    iVar37 = width;
    if (iVar38 < width) {
      iVar37 = iVar38;
    }
    if (iVar38 < -9) {
      iVar37 = -9;
    }
    iVar39 = (int)dVar29 + y;
    iVar38 = height;
    if (iVar39 < height) {
      iVar38 = iVar39;
    }
    dVar28 = (dVar48 * -1.5 + dVar41 * 0.5 + dVar60 + dVar60) * 16384.0;
    dVar29 = (dVar60 * -0.5 + dVar48 * 0.5) * 16384.0;
    if (iVar39 < -9) {
      iVar38 = -9;
    }
    puVar13 = ref + (long)iVar37 + lVar19 * ((long)iVar38 + -1);
    lVar25 = ((long)iVar37 << 0x20) + ((long)iVar38 + -1) * lVar22;
    lVar15 = lVar25 + 0x200000000;
    lVar24 = lVar25 + 0x100000000;
    lVar25 = lVar25 + -0x100000000;
    lVar20 = -1;
    psVar14 = local_198;
    do {
      lVar11 = 0;
      lVar16 = lVar15;
      lVar23 = lVar24;
      lVar26 = lVar25;
      do {
        *(int *)(psVar14 + lVar11 * 2) =
             (int)((uint)ref[lVar16 >> 0x20] * (int)dVar42 +
                   (uint)ref[lVar23 >> 0x20] * (int)dVar36 +
                   (uint)puVar13[lVar11] * (int)dVar31 + (uint)ref[lVar26 >> 0x20] * (int)dVar30 +
                  0x80) >> 8;
        lVar11 = lVar11 + 1;
        lVar16 = lVar16 + 0x100000000;
        lVar23 = lVar23 + 0x100000000;
        lVar26 = lVar26 + 0x100000000;
      } while (lVar11 != 8);
      lVar20 = lVar20 + 1;
      psVar14 = psVar14 + 0x10;
      puVar13 = puVar13 + lVar19;
      lVar15 = lVar15 + lVar22;
      lVar24 = lVar24 + lVar22;
      lVar25 = lVar25 + lVar22;
    } while (lVar20 != 10);
    dVar30 = rint(dVar28);
    uStack_334 = (undefined4)((ulong)dVar28 >> 0x20);
    uStack_330 = SUB84(dVar29,0);
    uStack_32c = (undefined4)((ulong)dVar29 >> 0x20);
    auVar2._4_8_ = extraout_XMM0_Qb;
    auVar2._0_4_ = uStack_334;
    auVar32._0_8_ = auVar2._0_8_ << 0x20;
    auVar32._8_4_ = uStack_330;
    auVar32._12_4_ = uStack_32c;
    dVar28 = rint(auVar32._8_8_);
    dVar41 = rint((dVar48 * -0.5 + dVar41 * -0.5 + dVar60) * 16384.0);
    dVar29 = rint((dVar48 * 1.5 + dVar60 * -2.5 + 1.0) * 16384.0);
    iVar44 = (int)dVar29;
    lVar15 = 0;
    puVar12 = local_138;
    psVar14 = local_218;
    psVar17 = local_298;
    iVar38 = 0;
    iVar39 = 0;
    iVar37 = iVar10;
    do {
      lVar24 = -8;
      do {
        auVar49._4_4_ = iVar44;
        auVar49._0_4_ = iVar44;
        auVar49._8_4_ = (int)dVar28;
        auVar49._12_4_ = (int)dVar28;
        iVar45 = ((int)((auVar49._8_8_ & 0xffffffff) * (ulong)*(uint *)(puVar12 + lVar24 * 4 + 0x20)
                       ) + iVar44 * *(int *)(puVar12 + lVar24 * 4 + -0x20) +
                  *(int *)(puVar12 + lVar24 * 4) * (int)dVar30 +
                  *(int *)(puVar12 + lVar24 * 4 + -0x40) * (int)dVar41 + 0x10000 >> 0x11) +
                 (uint)src[iVar37 + (int)lVar24 + 8] * -8;
        iVar38 = iVar38 + psVar14[lVar24 + 8] * iVar45;
        iVar39 = iVar39 + psVar17[lVar24 + 8] * iVar45;
        lVar24 = lVar24 + 1;
      } while (lVar24 != 0);
      lVar15 = lVar15 + 1;
      iVar37 = iVar37 + stride;
      psVar17 = psVar17 + 8;
      psVar14 = psVar14 + 8;
      puVar12 = puVar12 + 0x20;
    } while (lVar15 != 8);
    dVar28 = (double)iVar38 * (double)(iVar47 + 1) * dVar35 + (double)iVar39 * -dVar34 * dVar35;
    dVar29 = (double)iVar38 * -dVar34 * dVar35 + (double)iVar39 * dVar35 * (double)(iVar33 + 1);
    dVar41 = 2.0;
    if (dVar28 <= 2.0) {
      dVar41 = dVar28;
    }
    *u = dVar43 + (double)(-(ulong)(dVar28 < -2.0) & 0xc000000000000000 |
                          ~-(ulong)(dVar28 < -2.0) & (ulong)dVar41);
    dVar43 = 2.0;
    if (dVar29 <= 2.0) {
      dVar43 = dVar29;
    }
    *v = (double)(-(ulong)(dVar29 < -2.0) & 0xc000000000000000 |
                 ~-(ulong)(dVar29 < -2.0) & (ulong)dVar43) + *v;
  } while ((0.125 <= ABS(dVar29) + ABS(dVar28)) && (iVar40 = iVar40 + 1, iVar40 != 4));
  return;
}

Assistant:

void aom_compute_flow_at_point_c(const uint8_t *src, const uint8_t *ref, int x,
                                 int y, int width, int height, int stride,
                                 double *u, double *v) {
  double M[4];
  double M_inv[4];
  int b[2];
  int16_t dx[DISFLOW_PATCH_SIZE * DISFLOW_PATCH_SIZE];
  int16_t dy[DISFLOW_PATCH_SIZE * DISFLOW_PATCH_SIZE];

  // Compute gradients within this patch
  const uint8_t *src_patch = &src[y * stride + x];
  sobel_filter(src_patch, stride, dx, DISFLOW_PATCH_SIZE, 1);
  sobel_filter(src_patch, stride, dy, DISFLOW_PATCH_SIZE, 0);

  compute_flow_matrix(dx, DISFLOW_PATCH_SIZE, dy, DISFLOW_PATCH_SIZE, M);
  invert_2x2(M, M_inv);

  for (int itr = 0; itr < DISFLOW_MAX_ITR; itr++) {
    compute_flow_vector(src, ref, width, height, stride, x, y, *u, *v, dx, dy,
                        b);

    // Solve flow equations to find a better estimate for the flow vector
    // at this point
    const double step_u = M_inv[0] * b[0] + M_inv[1] * b[1];
    const double step_v = M_inv[2] * b[0] + M_inv[3] * b[1];
    *u += fclamp(step_u * DISFLOW_STEP_SIZE, -2, 2);
    *v += fclamp(step_v * DISFLOW_STEP_SIZE, -2, 2);

    if (fabs(step_u) + fabs(step_v) < DISFLOW_STEP_SIZE_THRESOLD) {
      // Stop iteration when we're close to convergence
      break;
    }
  }
}